

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void __thiscall SQFuncState::~SQFuncState(SQFuncState *this)

{
  SQUnsignedInteger SVar1;
  SQFuncState *in_RDI;
  
  while( true ) {
    SVar1 = sqvector<SQFuncState_*>::size(&in_RDI->_childstates);
    if (SVar1 == 0) break;
    PopChildState(in_RDI);
  }
  sqvector<SQFuncState_*>::~sqvector((sqvector<SQFuncState_*> *)in_RDI);
  sqvector<long_long>::~sqvector((sqvector<long_long> *)in_RDI);
  sqvector<long_long>::~sqvector((sqvector<long_long> *)in_RDI);
  sqvector<long_long>::~sqvector((sqvector<long_long> *)in_RDI);
  sqvector<long_long>::~sqvector((sqvector<long_long> *)in_RDI);
  sqvector<SQLineInfo>::~sqvector((sqvector<SQLineInfo> *)in_RDI);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  sqvector<SQLocalVarInfo>::~sqvector((sqvector<SQLocalVarInfo> *)in_RDI);
  sqvector<SQInstruction>::~sqvector((sqvector<SQInstruction> *)in_RDI);
  sqvector<SQOuterVar>::~sqvector((sqvector<SQOuterVar> *)in_RDI);
  sqvector<SQObjectPtr>::~sqvector((sqvector<SQObjectPtr> *)in_RDI);
  sqvector<SQObjectPtr>::~sqvector((sqvector<SQObjectPtr> *)in_RDI);
  sqvector<long_long>::~sqvector((sqvector<long_long> *)in_RDI);
  sqvector<long_long>::~sqvector((sqvector<long_long> *)in_RDI);
  sqvector<long_long>::~sqvector((sqvector<long_long> *)in_RDI);
  sqvector<SQLocalVarInfo>::~sqvector((sqvector<SQLocalVarInfo> *)in_RDI);
  return;
}

Assistant:

SQFuncState::~SQFuncState()
{
    while(_childstates.size() > 0)
    {
        PopChildState();
    }
}